

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerHLSL::type_to_consumed_locations(CompilerHLSL *this,SPIRType *type)

{
  uint32_t uVar1;
  size_t sVar2;
  TypedID *this_00;
  SPIRType *type_00;
  bool *pbVar3;
  uint *puVar4;
  uint local_28;
  int local_24;
  uint32_t i_1;
  uint32_t array_multiplier;
  uint32_t i;
  uint32_t elements;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  array_multiplier = 0;
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    for (i_1 = 0; sVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                    (&(type->member_types).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                    ), i_1 < (uint)sVar2; i_1 = i_1 + 1) {
      this_00 = (TypedID *)
                VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                          (&(type->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                           (ulong)i_1);
      uVar1 = TypedID::operator_cast_to_unsigned_int(this_00);
      type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
      uVar1 = type_to_consumed_locations(this,type_00);
      array_multiplier = uVar1 + array_multiplier;
    }
  }
  else {
    local_24 = 1;
    for (local_28 = 0;
        sVar2 = VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>),
        local_28 < (uint)sVar2; local_28 = local_28 + 1) {
      pbVar3 = VectorView<bool>::operator[]
                         (&(type->array_size_literal).super_VectorView<bool>,(ulong)local_28);
      if ((*pbVar3 & 1U) == 0) {
        puVar4 = VectorView<unsigned_int>::operator[]
                           (&(type->array).super_VectorView<unsigned_int>,(ulong)local_28);
        uVar1 = Compiler::evaluate_constant_u32((Compiler *)this,*puVar4);
      }
      else {
        puVar4 = VectorView<unsigned_int>::operator[]
                           (&(type->array).super_VectorView<unsigned_int>,(ulong)local_28);
        uVar1 = *puVar4;
      }
      local_24 = uVar1 * local_24;
    }
    array_multiplier = local_24 * type->columns;
  }
  return array_multiplier;
}

Assistant:

uint32_t CompilerHLSL::type_to_consumed_locations(const SPIRType &type) const
{
	// TODO: Need to verify correctness.
	uint32_t elements = 0;

	if (type.basetype == SPIRType::Struct)
	{
		for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
			elements += type_to_consumed_locations(get<SPIRType>(type.member_types[i]));
	}
	else
	{
		uint32_t array_multiplier = 1;
		for (uint32_t i = 0; i < uint32_t(type.array.size()); i++)
		{
			if (type.array_size_literal[i])
				array_multiplier *= type.array[i];
			else
				array_multiplier *= evaluate_constant_u32(type.array[i]);
		}
		elements += array_multiplier * type.columns;
	}
	return elements;
}